

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkAbcDec.c
# Opt level: O3

Abc_Obj_t * Lpk_Implement_rec(Lpk_Man_t *pMan,Abc_Ntk_t *pNtk,Vec_Ptr_t *vLeaves,Lpk_Fun_t *pFun)

{
  uint uVar1;
  Abc_Obj_t *pAVar2;
  ulong uVar3;
  
  if ((*(ushort *)&pFun->field_0x8 & 0xf80) != 0) {
    uVar3 = 0;
    do {
      uVar1 = (uint)pFun->pFanins[uVar3];
      if ((pFun->pFanins[uVar3] < '\0') || (vLeaves->nSize <= (int)uVar1)) {
LAB_004e1a44:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      if (((ulong)vLeaves->pArray[uVar1] & 1) == 0) {
        Lpk_Implement_rec(pMan,pNtk,vLeaves,(Lpk_Fun_t *)vLeaves->pArray[uVar1]);
        uVar1 = (uint)pFun->pFanins[uVar3];
        if (pFun->pFanins[uVar3] < '\0') goto LAB_004e1a44;
      }
      if (vLeaves->nSize <= (int)uVar1) goto LAB_004e1a44;
      if (((ulong)vLeaves->pArray[uVar1] & 1) == 0) {
        __assert_fail("Abc_ObjIsComplement(pFanin)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/lpk/lpkAbcDec.c"
                      ,99,
                      "Abc_Obj_t *Lpk_Implement_rec(Lpk_Man_t *, Abc_Ntk_t *, Vec_Ptr_t *, Lpk_Fun_t *)"
                     );
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < (*(uint *)&pFun->field_0x8 >> 7 & 0x1f));
  }
  pAVar2 = Lpk_ImplementFun(pMan,pNtk,vLeaves,pFun);
  uVar1 = *(uint *)&pFun->field_0x8 & 0x7f;
  if ((int)uVar1 < vLeaves->nSize) {
    vLeaves->pArray[uVar1] = (void *)((ulong)pAVar2 ^ 1);
    Lpk_FunFree(pFun);
    return pAVar2;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
}

Assistant:

Abc_Obj_t * Lpk_Implement_rec( Lpk_Man_t * pMan, Abc_Ntk_t * pNtk, Vec_Ptr_t * vLeaves, Lpk_Fun_t * pFun )
{
    Abc_Obj_t * pFanin, * pRes;
    int i;
    // prepare the leaves of the function
    for ( i = 0; i < (int)pFun->nVars; i++ )
    {
        pFanin = (Abc_Obj_t *)Vec_PtrEntry( vLeaves, pFun->pFanins[i] );
        if ( !Abc_ObjIsComplement(pFanin) )
            Lpk_Implement_rec( pMan, pNtk, vLeaves, (Lpk_Fun_t *)pFanin );
        pFanin = (Abc_Obj_t *)Vec_PtrEntry( vLeaves, pFun->pFanins[i] );
        assert( Abc_ObjIsComplement(pFanin) );
    }
    // construct the function
    pRes = Lpk_ImplementFun( pMan, pNtk, vLeaves, pFun );
    // replace the function
    Vec_PtrWriteEntry( vLeaves, pFun->Id, Abc_ObjNot(pRes) );
    Lpk_FunFree( pFun );
    return pRes;
}